

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O3

bool __thiscall FirewirePort::Init(FirewirePort *this)

{
  uint uVar1;
  int iVar2;
  raw1394handle_t prVar3;
  ostream *poVar4;
  FirewirePort *pFVar5;
  bus_reset_handler_t p_Var6;
  long *plVar7;
  void *pvVar8;
  size_t sVar9;
  long lVar10;
  pointer ppFVar11;
  ulong uVar12;
  char *pcVar13;
  FirewirePort *local_38;
  
  prVar3 = (raw1394handle_t)raw1394_new_handle();
  this->handle = prVar3;
  if (prVar3 == (raw1394handle_t)0x0) {
    poVar4 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"FirewirePort::Init: error, could not create handle",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    ppFVar11 = PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pFVar5 = *ppFVar11;
        if ((pFVar5->super_BasePort).PortNum == (this->super_BasePort).PortNum) {
          poVar4 = (this->super_BasePort).outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"FirewirePort::Init: warning, port ",0x22);
          poVar4 = (ostream *)
                   std::ostream::operator<<((ostream *)poVar4,(this->super_BasePort).PortNum);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," is already used (be careful about thread safety)",0x31);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          pFVar5 = *ppFVar11;
        }
        if (pFVar5->handle == this->handle) {
          poVar4 = (this->super_BasePort).outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"FirewirePort::Init: warning, handle is already used",0x33);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        ppFVar11 = ppFVar11 + 1;
      } while (ppFVar11 !=
               PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_38 = this;
    std::vector<FirewirePort*,std::allocator<FirewirePort*>>::emplace_back<FirewirePort*>
              ((vector<FirewirePort*,std::allocator<FirewirePort*>> *)&PortList,&local_38);
    builtin_memcpy((this->super_BasePort).Node2Board,
                   "\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10"
                   ,0x40);
    p_Var6 = (bus_reset_handler_t)raw1394_set_bus_reset_handler(this->handle,reset_handler);
    this->old_reset_handler = p_Var6;
    uVar1 = raw1394_get_port_info(this->handle,0,0);
    poVar4 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"FirewirePort::Init: number of ports = ",0x26);
    plVar7 = (long *)std::ostream::operator<<((ostream *)poVar4,uVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    if (0 < (int)uVar1) {
      pvVar8 = operator_new__((ulong)uVar1 * 0x24);
      raw1394_get_port_info(this->handle,pvVar8,uVar1);
      pcVar13 = (char *)((long)pvVar8 + 4);
      uVar12 = 0;
      do {
        poVar4 = (this->super_BasePort).outStr;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Port ",7);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        sVar9 = strlen(pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar13,sVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)(pcVar13 + -4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," nodes",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        uVar12 = uVar12 + 1;
        pcVar13 = pcVar13 + 0x24;
      } while (uVar1 != uVar12);
      operator_delete__(pvVar8);
    }
    if ((int)uVar1 < (this->super_BasePort).PortNum) {
      poVar4 = (this->super_BasePort).outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"FirewirePort::Init: port ",0x19);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(this->super_BasePort).PortNum)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," does not exist",0xf);
      lVar10 = *(long *)poVar4;
    }
    else {
      iVar2 = raw1394_set_port(this->handle);
      poVar4 = (this->super_BasePort).outStr;
      if (iVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"FirewirePort::Init: successfully initialized port ",0x32);
        plVar7 = (long *)std::ostream::operator<<((ostream *)poVar4,(this->super_BasePort).PortNum);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        poVar4 = (this->super_BasePort).outStr;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Using libraw1394 version ",0x19);
        pcVar13 = (char *)raw1394_get_libversion();
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar13,sVar9);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        StopCycleStartPacket(this);
        iVar2 = (*(this->super_BasePort)._vptr_BasePort[3])(this);
        if ((char)iVar2 == '\0') {
          return false;
        }
        BasePort::SetDefaultProtocol(&this->super_BasePort);
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"FirewirePort::Init: error setting port to ",0x2a);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(this->super_BasePort).PortNum)
      ;
      lVar10 = *(long *)poVar4;
    }
    std::ios::widen((char)*(undefined8 *)(lVar10 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    raw1394_destroy_handle(this->handle);
    this->handle = (raw1394handle_t)0x0;
  }
  return false;
}

Assistant:

bool FirewirePort::Init(void)
{
    // create firewire port handle
    handle = raw1394_new_handle();
    if (!handle) {
        outStr << "FirewirePort::Init: error, could not create handle" << std::endl;
        return false;
    }

    PortListType::const_iterator it;
    for (it = PortList.begin(); it != PortList.end(); it++) {
        if ((*it)->PortNum == PortNum)
            outStr << "FirewirePort::Init: warning, port " << PortNum
                   << " is already used (be careful about thread safety)" << std::endl;
        if ((*it)->handle == handle) // should never happen
            outStr << "FirewirePort::Init: warning, handle is already used" << std::endl;
    }
    PortList.push_back(this);

    memset(Node2Board, BoardIO::MAX_BOARDS, sizeof(Node2Board));

    // set the bus reset handler
    old_reset_handler = raw1394_set_bus_reset_handler(handle, reset_handler);

    // get number of ports
    int nports = raw1394_get_port_info(handle, NULL, 0);
    outStr << "FirewirePort::Init: number of ports = " << nports << std::endl;
    if (nports > 0) {
        struct raw1394_portinfo *pinfo = new raw1394_portinfo[nports];
        raw1394_get_port_info(handle, pinfo, nports);
        for (int i = 0; i < nports; i++)
            outStr << "  Port " << i << ": " << pinfo[i].name << ", " << pinfo[i].nodes << " nodes" << std::endl;
        delete [] pinfo;
    }
    if (nports < PortNum) {
        outStr << "FirewirePort::Init: port " << PortNum << " does not exist" << std::endl;
        raw1394_destroy_handle(handle);
        handle = NULL;
        return false;
    }

    if (raw1394_set_port(handle, PortNum)) {
        outStr << "FirewirePort::Init: error setting port to " << PortNum << std::endl;
        raw1394_destroy_handle(handle);
        handle = NULL;
        return false;
    }
    outStr << "FirewirePort::Init: successfully initialized port " << PortNum << std::endl;
    outStr << "Using libraw1394 version " << raw1394_get_libversion() << std::endl;

    // stop cycle start packet
    StopCycleStartPacket();

    bool ret = ScanNodes();
    if (ret)
        SetDefaultProtocol();
    return ret;
}